

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::calculateVertexPositions
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  AnchorVertex **ppAVar1;
  bool bVar2;
  AnchorData *edge;
  long lVar3;
  long lVar4;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  int i;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  AnchorVertex *root;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_c8;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_b8;
  value_type local_98;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_88;
  Data *local_68;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_60;
  QArrayDataPointer<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)0x0;
  local_58.size = 0;
  local_60.d = (Data *)0x0;
  this_00 = (this->graph).m_data + (long)(int)orientation + -1;
  local_68 = (this->graph).m_data[(long)(int)orientation + 1].m_graph.d;
  local_68->seed = 0;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_88,(AnchorVertex **)&local_60);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_88,this_00,
             (AnchorVertex *)local_68);
  ppAVar1 = local_88.ptr;
  lVar4 = local_88.size << 3;
  for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 8) {
    local_b8.ptr = *(AnchorVertex ***)((long)ppAVar1 + lVar3);
    local_b8.d = (Data *)local_68;
    QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>::
    emplaceBack<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
              ((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                *)&local_58,
               (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                *)&local_b8);
  }
  setupEdgesInterpolation(this,orientation);
  while (local_58.size != 0) {
    local_98.second = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.first = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               ::takeFirst((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                            *)&local_58);
    edge = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
                     (this_00,local_98.first,local_98.second);
    bVar2 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::contains
                      (&local_60,&local_98.second);
    if (!bVar2) {
      QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
                ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_b8,
                 (AnchorVertex **)&local_60);
      interpolateEdge(this,local_98.first,edge);
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_b8,this_00,
                       local_98.second);
      for (puVar5 = (undefined1 *)0x0; puVar5 < (ulong)local_b8.size; puVar5 = puVar5 + 1) {
        bVar2 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::contains
                          (&local_60,local_b8.ptr + (long)puVar5);
        if (!bVar2) {
          local_c8.first = local_98.second;
          local_c8.second = local_b8.ptr[(long)puVar5];
          QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
          ::
          emplaceBack<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                    ((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                      *)&local_58,&local_c8);
        }
      }
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_b8);
    }
  }
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_88);
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_60);
  QArrayDataPointer<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::calculateVertexPositions(Qt::Orientation orientation)
{
    QQueue<std::pair<AnchorVertex *, AnchorVertex *> > queue;
    QSet<AnchorVertex *> visited;

    // Get root vertex
    AnchorVertex *root = layoutFirstVertex[orientation];

    root->distance = 0;
    visited.insert(root);

    // Add initial edges to the queue
    const auto adjacentVertices = graph[orientation].adjacentVertices(root);
    for (AnchorVertex *v : adjacentVertices)
        queue.enqueue(std::pair(root, v));

    // Do initial calculation required by "interpolateEdge()"
    setupEdgesInterpolation(orientation);

    // Traverse the graph and calculate vertex positions
    while (!queue.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = queue.dequeue();
        AnchorData *edge = graph[orientation].edgeData(pair.first, pair.second);

        if (visited.contains(pair.second))
            continue;

        visited.insert(pair.second);
        interpolateEdge(pair.first, edge);

        QList<AnchorVertex *> adjacents = graph[orientation].adjacentVertices(pair.second);
        for (int i = 0; i < adjacents.size(); ++i) {
            if (!visited.contains(adjacents.at(i)))
                queue.enqueue(std::pair(pair.second, adjacents.at(i)));
        }
    }
}